

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::Clara::Detail::ParserBase::parse
          (InternalParseResult *__return_storage_ptr__,ParserBase *this,Args *args)

{
  string *psVar1;
  TokenStream local_48;
  Args *local_20;
  Args *args_local;
  ParserBase *this_local;
  
  local_20 = args;
  args_local = (Args *)this;
  this_local = (ParserBase *)__return_storage_ptr__;
  psVar1 = Args::exeName_abi_cxx11_(args);
  TokenStream::TokenStream(&local_48,local_20);
  (*this->_vptr_ParserBase[3])(__return_storage_ptr__,this,psVar1,&local_48);
  TokenStream::~TokenStream(&local_48);
  return __return_storage_ptr__;
}

Assistant:

InternalParseResult ParserBase::parse( Args const& args ) const {
                return parse( args.exeName(), TokenStream( args ) );
            }